

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_lock.hpp
# Opt level: O0

void __thiscall unodb::optimistic_lock::dump(optimistic_lock *this,ostream *os)

{
  ostream *this_00;
  version_type local_38;
  version_type dump_version;
  ostream *os_local;
  optimistic_lock *this_local;
  memory_order __b;
  
  dump_version.version = (version_tag_type)os;
  local_38 = atomic_version_type::load_acquire(&this->version);
  std::operator<<((ostream *)dump_version.version,"lock: ");
  version_type::dump(&local_38,(ostream *)dump_version.version);
  this_00 = std::operator<<((ostream *)dump_version.version," current read lock count = ");
  std::operator&(acquire,__memory_order_mask);
  std::ostream::operator<<(this_00,(this->read_lock_count).super___atomic_base<long>._M_i);
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream &os) const {
    const auto dump_version = version.load_acquire();
    os << "lock: ";
    dump_version.dump(os);
#ifndef NDEBUG
    os << " current read lock count = "
       << read_lock_count.load(std::memory_order_acquire);
#endif
  }